

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastSqrt(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int b;
  int iVar1;
  long lVar2;
  int *ps;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  uint nSize;
  ulong uVar8;
  int Carry;
  int *local_90;
  Gia_Man_t *local_88;
  Vec_Int_t *local_80;
  long local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  int *local_40;
  ulong local_38;
  
  Carry = -1;
  local_88 = pNew;
  local_60 = pNum;
  if ((nNum & 1U) == 0) {
    nSize = nNum >> 1;
    Vec_IntFill(vRes,nSize,0);
    Vec_IntFill(vTmp,nNum * 2,0);
    local_68 = vRes->pArray;
    ps = vTmp->pArray;
    local_78 = (long)nNum;
    local_90 = ps + local_78;
    if ((int)nSize < 1) {
      nSize = 0;
    }
    local_58 = (ulong)nSize;
    uVar6 = 3;
    lVar4 = 1;
    uVar5 = 0;
    piVar7 = local_68;
    local_80 = vRes;
    local_70 = ps;
    while (piVar7 = piVar7 + 1, uVar5 != local_58) {
      lVar2 = local_78 + uVar5 * -2;
      *local_90 = local_60[lVar2 + -2];
      local_90[1] = local_60[lVar2 + -1];
      for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
        local_90[lVar2 + 2] = ps[lVar2];
      }
      local_50 = uVar5 + 1;
      local_38 = uVar5 + 2;
      local_48 = lVar4;
      local_40 = piVar7;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = local_90[uVar8];
        if (uVar8 < local_38 && 1 < uVar8) {
          b = Abc_LitNot(*piVar7);
          iVar3 = Carry;
        }
        else {
          iVar3 = 1;
          if (uVar8 != 0) {
            iVar3 = Carry;
          }
          b = Abc_LitNot(iVar3);
          iVar3 = 1;
        }
        Wlc_BlastFullAdder(local_88,iVar1,b,iVar3,&Carry,ps);
        if (uVar5 <= (int)uVar8 - 1) {
          Carry = Abc_LitNot(Carry);
        }
        ps = ps + 1;
        piVar7 = piVar7 + -1;
      }
      iVar1 = Abc_LitNot(Carry);
      piVar7 = local_68;
      ps = local_70;
      local_68[uVar5] = iVar1;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = Gia_ManHashMux(local_88,piVar7[uVar5],ps[uVar8],local_90[uVar8]);
        ps[uVar8] = iVar1;
      }
      lVar4 = local_48 + 1;
      uVar6 = uVar6 + 1;
      uVar5 = local_50;
      piVar7 = local_40;
    }
    Vec_IntReverseOrder(local_80);
    return;
  }
  __assert_fail("nNum % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x2fb,"void Wlc_BlastSqrt(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastSqrt( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pRes, * pSum, * pSumP;
    int i, k, Carry = -1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pRes = Vec_IntArray( vRes );
    pSum = Vec_IntArray( vTmp );
    pSumP = pSum + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        pSumP[0] = pNum[nNum-2*i-2];
        pSumP[1] = pNum[nNum-2*i-1];
        for ( k = 0; k < i+1; k++ )
            pSumP[k+2] = pSum[k];
        for ( k = 0; k < i + 3; k++ )
        {
            if ( k >= 2 && k < i + 2 ) // middle ones
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(pRes[i-k+1]), Carry, &Carry, &pSum[k] );
            else
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(k ? Carry:1), 1,     &Carry, &pSum[k] );
            if ( k == 0 || k > i )
                Carry = Abc_LitNot(Carry);
        }
        pRes[i] = Abc_LitNot(Carry);
        for ( k = 0; k < i + 3; k++ )
            pSum[k] = Gia_ManHashMux( pNew, pRes[i], pSum[k], pSumP[k] );
    }
    Vec_IntReverseOrder( vRes );
}